

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

void xmlTextReaderFreeNode(xmlTextReaderPtr reader,xmlNodePtr cur)

{
  int iVar1;
  xmlDeregisterNodeFunc *pp_Var2;
  xmlDictPtr local_20;
  xmlDictPtr dict;
  xmlNodePtr cur_local;
  xmlTextReaderPtr reader_local;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->ctxt == (xmlParserCtxtPtr)0x0)) {
    local_20 = (xmlDictPtr)0x0;
  }
  else {
    local_20 = reader->ctxt->dict;
  }
  if (cur->type == XML_DTD_NODE) {
    xmlFreeDtd((xmlDtdPtr)cur);
  }
  else if (cur->type == XML_NAMESPACE_DECL) {
    xmlFreeNs((xmlNsPtr)cur);
  }
  else if (cur->type == XML_ATTRIBUTE_NODE) {
    xmlTextReaderFreeProp(reader,(xmlAttrPtr)cur);
  }
  else {
    if ((cur->children != (_xmlNode *)0x0) && (cur->type != XML_ENTITY_REF_NODE)) {
      if (cur->children->parent == cur) {
        xmlTextReaderFreeNodeList(reader,cur->children);
      }
      cur->children = (_xmlNode *)0x0;
    }
    if ((__xmlRegisterCallbacks != 0) &&
       (pp_Var2 = __xmlDeregisterNodeDefaultValue(), *pp_Var2 != (xmlDeregisterNodeFunc)0x0)) {
      pp_Var2 = __xmlDeregisterNodeDefaultValue();
      (**pp_Var2)(cur);
    }
    if ((((cur->type == XML_ELEMENT_NODE) || (cur->type == XML_XINCLUDE_START)) ||
        (cur->type == XML_XINCLUDE_END)) && (cur->properties != (_xmlAttr *)0x0)) {
      xmlTextReaderFreePropList(reader,cur->properties);
    }
    if ((((((_xmlAttr **)cur->content != &cur->properties) && (cur->type != XML_ELEMENT_NODE)) &&
         ((cur->type != XML_XINCLUDE_START &&
          ((cur->type != XML_XINCLUDE_END && (cur->type != XML_ENTITY_REF_NODE)))))) &&
        (cur->content != (xmlChar *)0x0)) &&
       ((local_20 == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(local_20,cur->content), iVar1 == 0))))
    {
      (*xmlFree)(cur->content);
    }
    if ((((cur->type == XML_ELEMENT_NODE) || (cur->type == XML_XINCLUDE_START)) ||
        (cur->type == XML_XINCLUDE_END)) && (cur->nsDef != (xmlNs *)0x0)) {
      xmlFreeNsList(cur->nsDef);
    }
    if (((cur->type != XML_TEXT_NODE) && (cur->type != XML_COMMENT_NODE)) &&
       ((cur->name != (xmlChar *)0x0 &&
        ((local_20 == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(local_20,cur->name), iVar1 == 0))))))
    {
      (*xmlFree)(cur->name);
    }
    if ((((cur->type == XML_ELEMENT_NODE) || (cur->type == XML_TEXT_NODE)) &&
        (reader != (xmlTextReaderPtr)0x0)) &&
       ((reader->ctxt != (xmlParserCtxtPtr)0x0 && (reader->ctxt->freeElemsNr < 100)))) {
      cur->next = reader->ctxt->freeElems;
      reader->ctxt->freeElems = cur;
      reader->ctxt->freeElemsNr = reader->ctxt->freeElemsNr + 1;
    }
    else {
      (*xmlFree)(cur);
    }
  }
  return;
}

Assistant:

static void
xmlTextReaderFreeNode(xmlTextReaderPtr reader, xmlNodePtr cur) {
    xmlDictPtr dict;

    if ((reader != NULL) && (reader->ctxt != NULL))
	dict = reader->ctxt->dict;
    else
        dict = NULL;
    if (cur->type == XML_DTD_NODE) {
	xmlFreeDtd((xmlDtdPtr) cur);
	return;
    }
    if (cur->type == XML_NAMESPACE_DECL) {
	xmlFreeNs((xmlNsPtr) cur);
        return;
    }
    if (cur->type == XML_ATTRIBUTE_NODE) {
	xmlTextReaderFreeProp(reader, (xmlAttrPtr) cur);
	return;
    }

    if ((cur->children != NULL) &&
	(cur->type != XML_ENTITY_REF_NODE)) {
	if (cur->children->parent == cur)
	    xmlTextReaderFreeNodeList(reader, cur->children);
	cur->children = NULL;
    }

    if ((__xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue(cur);

    if (((cur->type == XML_ELEMENT_NODE) ||
	 (cur->type == XML_XINCLUDE_START) ||
	 (cur->type == XML_XINCLUDE_END)) &&
	(cur->properties != NULL))
	xmlTextReaderFreePropList(reader, cur->properties);
    if ((cur->content != (xmlChar *) &(cur->properties)) &&
        (cur->type != XML_ELEMENT_NODE) &&
	(cur->type != XML_XINCLUDE_START) &&
	(cur->type != XML_XINCLUDE_END) &&
	(cur->type != XML_ENTITY_REF_NODE)) {
	DICT_FREE(cur->content);
    }
    if (((cur->type == XML_ELEMENT_NODE) ||
	 (cur->type == XML_XINCLUDE_START) ||
	 (cur->type == XML_XINCLUDE_END)) &&
	(cur->nsDef != NULL))
	xmlFreeNsList(cur->nsDef);

    /*
     * we don't free names here they are interned now
     */
    if ((cur->type != XML_TEXT_NODE) &&
        (cur->type != XML_COMMENT_NODE))
	DICT_FREE(cur->name);

    if (((cur->type == XML_ELEMENT_NODE) ||
	 (cur->type == XML_TEXT_NODE)) &&
	(reader != NULL) && (reader->ctxt != NULL) &&
	(reader->ctxt->freeElemsNr < MAX_FREE_NODES)) {
	cur->next = reader->ctxt->freeElems;
	reader->ctxt->freeElems = cur;
	reader->ctxt->freeElemsNr++;
    } else {
	xmlFree(cur);
    }
}